

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeCommand,string *makeProgram,string *param_3,string *param_4,string *targetName,
          string *param_6,bool fast,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  pointer ppcVar1;
  cmMakefile *pcVar2;
  Snapshot snapshot;
  bool bVar3;
  cmLocalGenerator *pcVar4;
  char *pcVar5;
  allocator local_a9;
  string tname;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Snapshot local_48;
  
  std::__cxx11::string::string((string *)&local_88,"",&local_a9);
  cmGlobalGenerator::SelectMakeProgram(&tname,&this->super_cmGlobalGenerator,makeProgram,&local_88);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,&tname
            );
  std::__cxx11::string::~string((string *)&tname);
  std::__cxx11::string::~string((string *)&local_88);
  (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[2])(&local_68,this);
  bVar3 = cmHasLiteralPrefix<std::__cxx11::string,16ul>(&local_68,(char (*) [16])"NMake Makefiles");
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar3) {
    std::__cxx11::string::string((string *)&tname,"/NOLOGO",(allocator *)&local_88);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
               &tname);
    std::__cxx11::string::~string((string *)&tname);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (makeCommand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  if (targetName->_M_string_length != 0) {
    ppcVar1 = (this->super_cmGlobalGenerator).LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar1 ==
        (this->super_cmGlobalGenerator).LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
      snapshot.Position.Tree = local_48.Position.Tree;
      snapshot.State = local_48.State;
      snapshot.Position.Position = local_48.Position.Position;
      pcVar4 = cmGlobalGenerator::MakeLocalGenerator
                         (&this->super_cmGlobalGenerator,snapshot,(cmLocalGenerator *)0x0);
      pcVar2 = pcVar4->Makefile;
      pcVar5 = cmake::GetHomeDirectory((this->super_cmGlobalGenerator).CMakeInstance);
      std::__cxx11::string::string((string *)&tname,pcVar5,(allocator *)&local_88);
      cmMakefile::SetCurrentSourceDirectory(pcVar2,&tname);
      std::__cxx11::string::~string((string *)&tname);
      pcVar2 = pcVar4->Makefile;
      pcVar5 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
      std::__cxx11::string::string((string *)&tname,pcVar5,(allocator *)&local_88);
      cmMakefile::SetCurrentBinaryDirectory(pcVar2,&tname);
      std::__cxx11::string::~string((string *)&tname);
    }
    else {
      pcVar4 = *ppcVar1;
    }
    std::__cxx11::string::string((string *)&tname,(string *)targetName);
    if (fast) {
      std::__cxx11::string::append((char *)&tname);
    }
    cmOutputConverter::Convert
              (&local_88,&pcVar4->super_cmOutputConverter,&tname,HOME_OUTPUT,UNCHANGED);
    std::__cxx11::string::operator=((string *)&tname,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    cmSystemTools::ConvertToOutputSlashes(&tname);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(makeCommand,&tname);
    if (pcVar4 != (cmLocalGenerator *)0x0 &&
        (this->super_cmGlobalGenerator).LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->super_cmGlobalGenerator).LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (*pcVar4->_vptr_cmLocalGenerator[1])(pcVar4);
    }
    std::__cxx11::string::~string((string *)&tname);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::GenerateBuildCommand(std::vector<std::string>& makeCommand,
                       const std::string& makeProgram,
                       const std::string& /*projectName*/,
                       const std::string& /*projectDir*/,
                       const std::string& targetName,
                       const std::string& /*config*/,
                       bool fast, bool /*verbose*/,
                       std::vector<std::string> const& makeOptions)
{
  makeCommand.push_back(
    this->SelectMakeProgram(makeProgram)
    );

  // Since we have full control over the invocation of nmake, let us
  // make it quiet.
  if (cmHasLiteralPrefix(this->GetName(), "NMake Makefiles"))
    {
    makeCommand.push_back("/NOLOGO");
    }
  makeCommand.insert(makeCommand.end(),
                     makeOptions.begin(), makeOptions.end());
  if (!targetName.empty())
    {
    cmLocalUnixMakefileGenerator3 *lg;
    if (!this->LocalGenerators.empty())
      {
      lg = static_cast<cmLocalUnixMakefileGenerator3 *>
        (this->LocalGenerators[0]);
      }
    else
      {
      lg = static_cast<cmLocalUnixMakefileGenerator3 *>
        (this->MakeLocalGenerator());
      // set the Start directories
      lg->GetMakefile()->SetCurrentSourceDirectory
        (this->CMakeInstance->GetHomeDirectory());
      lg->GetMakefile()->SetCurrentBinaryDirectory
        (this->CMakeInstance->GetHomeOutputDirectory());
      }

    std::string tname = targetName;
    if(fast)
      {
      tname += "/fast";
      }
    tname = lg->Convert(tname,cmLocalGenerator::HOME_OUTPUT);
    cmSystemTools::ConvertToOutputSlashes(tname);
    makeCommand.push_back(tname);
    if (this->LocalGenerators.empty())
      {
      delete lg;
      }
    }
}